

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

FieldSourceInfoBuilderPair * __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::addMemberSchema
          (FieldSourceInfoBuilderPair *__return_storage_ptr__,MemberInfo *this)

{
  SegmentBuilder *pSVar1;
  CapTableBuilder *pCVar2;
  PointerType PVar3;
  WirePointer *pWVar4;
  Fault f;
  ListBuilder local_a0;
  ListBuilder local_78;
  PointerBuilder local_48;
  
  if (this->childInitializedCount < this->childCount) {
    pSVar1 = (this->node)._builder.segment;
    pCVar2 = (this->node)._builder.capTable;
    pWVar4 = (this->node)._builder.pointers + 3;
    local_78.segment = pSVar1;
    local_78.capTable = pCVar2;
    local_78.ptr = (byte *)pWVar4;
    PVar3 = capnp::_::PointerBuilder::getPointerType((PointerBuilder *)&local_78);
    local_a0.segment = pSVar1;
    local_a0.capTable = pCVar2;
    local_a0.ptr = (byte *)pWVar4;
    if (PVar3 == NULL_) {
      if (this->parent != (MemberInfo *)0x0) {
        getSchema((Builder *)&local_78,this);
      }
      capnp::_::PointerBuilder::initStructList
                (&local_78,(PointerBuilder *)&local_a0,this->childCount,(StructSize)0x40003);
      capnp::_::ListBuilder::getStructElement
                ((StructBuilder *)__return_storage_ptr__,&local_78,this->childInitializedCount);
      local_48.pointer = (this->sourceInfo)._builder.pointers + 1;
      local_48.segment = (this->sourceInfo)._builder.segment;
      local_48.capTable = (this->sourceInfo)._builder.capTable;
      capnp::_::PointerBuilder::initStructList
                (&local_a0,&local_48,this->childCount,(StructSize)0x10000);
    }
    else {
      capnp::_::PointerBuilder::getStructList
                (&local_78,(PointerBuilder *)&local_a0,(StructSize)0x40003,(word *)0x0);
      capnp::_::ListBuilder::getStructElement
                ((StructBuilder *)__return_storage_ptr__,&local_78,this->childInitializedCount);
      local_48.pointer = (this->sourceInfo)._builder.pointers + 1;
      local_48.segment = (this->sourceInfo)._builder.segment;
      local_48.capTable = (this->sourceInfo)._builder.capTable;
      capnp::_::PointerBuilder::getStructList(&local_a0,&local_48,(StructSize)0x10000,(word *)0x0);
    }
    capnp::_::ListBuilder::getStructElement
              (&(__return_storage_ptr__->sourceInfo)._builder,&local_a0,this->childInitializedCount)
    ;
    this->childInitializedCount = this->childInitializedCount + 1;
    return __return_storage_ptr__;
  }
  local_a0.segment = (SegmentBuilder *)0x0;
  local_78.segment = (SegmentBuilder *)0x0;
  local_78.capTable = (CapTableBuilder *)0x0;
  kj::_::Debug::Fault::init
            ((Fault *)&local_a0,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
            );
  kj::_::Debug::Fault::fatal((Fault *)&local_a0);
}

Assistant:

addMemberSchema() {
      // Get the schema builder for the child member at the given index.  This lazily/dynamically
      // builds the builder tree.

      KJ_REQUIRE(childInitializedCount < childCount);

      auto structNode = node.getStruct();
      if (!structNode.hasFields()) {
        if (parent != nullptr) {
          getSchema();  // Make sure field exists in parent once the first child is added.
        }
        FieldSourceInfoBuilderPair result {
          structNode.initFields(childCount)[childInitializedCount],
          sourceInfo.initMembers(childCount)[childInitializedCount]
        };
        ++childInitializedCount;
        return result;
      } else {
        FieldSourceInfoBuilderPair result {
          structNode.getFields()[childInitializedCount],
          sourceInfo.getMembers()[childInitializedCount]
        };
        ++childInitializedCount;
        return result;
      }
    }